

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O3

void Ssw_SmlAssignDist1Plus(Ssw_Sml_t *p,uint *pPat)

{
  uint *puVar1;
  Aig_Man_t *pAVar2;
  uint uVar3;
  int iVar4;
  Vec_Ptr_t *pVVar5;
  int iFrame;
  long lVar6;
  ulong uVar7;
  bool bVar8;
  
  if (p->nFrames < 1) {
    __assert_fail("p->nFrames > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswSim.c"
                  ,0x2a6,"void Ssw_SmlAssignDist1Plus(Ssw_Sml_t *, unsigned int *)");
  }
  pAVar2 = p->pAig;
  pVVar5 = pAVar2->vCis;
  if (0 < pVVar5->nSize) {
    uVar7 = 0;
    do {
      Ssw_SmlObjAssignConst
                (p,(Aig_Obj_t *)pVVar5->pArray[uVar7],
                 (uint)((pPat[uVar7 >> 5 & 0x7ffffff] >> ((uint)uVar7 & 0x1f) & 1) != 0),0);
      uVar7 = uVar7 + 1;
      pAVar2 = p->pAig;
      pVVar5 = pAVar2->vCis;
    } while ((long)uVar7 < (long)pVVar5->nSize);
  }
  uVar3 = p->nWordsFrame * 0x20 - 1;
  if (pAVar2->nTruePis < (int)uVar3) {
    uVar3 = pAVar2->nTruePis;
  }
  if (0 < (int)uVar3) {
    uVar7 = 1;
    do {
      if ((long)pVVar5->nSize <= (long)(uVar7 - 1)) {
LAB_0062451e:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      puVar1 = (uint *)((long)&p[1].pAig +
                       (uVar7 >> 5 & 0x7ffffff) * 4 +
                       (long)p->nWordsTotal * (long)*(int *)((long)pVVar5->pArray[uVar7 - 1] + 0x24)
                       * 4);
      *puVar1 = *puVar1 ^ 1 << ((byte)uVar7 & 0x1f);
      bVar8 = uVar7 != uVar3;
      uVar7 = uVar7 + 1;
    } while (bVar8);
  }
  iVar4 = p->nFrames;
  if (1 < iVar4) {
    iFrame = 1;
    do {
      if (0 < pAVar2->nTruePis) {
        lVar6 = 0;
        do {
          if (pAVar2->vCis->nSize <= lVar6) goto LAB_0062451e;
          Ssw_SmlAssignRandomFrame(p,(Aig_Obj_t *)pAVar2->vCis->pArray[lVar6],iFrame);
          lVar6 = lVar6 + 1;
          pAVar2 = p->pAig;
        } while (lVar6 < pAVar2->nTruePis);
        iVar4 = p->nFrames;
      }
      iFrame = iFrame + 1;
    } while (iFrame < iVar4);
  }
  return;
}

Assistant:

void Ssw_SmlAssignDist1Plus( Ssw_Sml_t * p, unsigned * pPat )
{
    Aig_Obj_t * pObj;
    int f, i, Limit;
    assert( p->nFrames > 0 );

    // copy the pattern into the primary inputs
    Aig_ManForEachCi( p->pAig, pObj, i )
        Ssw_SmlObjAssignConst( p, pObj, Abc_InfoHasBit(pPat, i), 0 );

    // set distance one PIs for the first frame
    Limit = Abc_MinInt( Saig_ManPiNum(p->pAig), p->nWordsFrame * 32 - 1 );
    for ( i = 0; i < Limit; i++ )
        Abc_InfoXorBit( Ssw_ObjSim( p, Aig_ManCi(p->pAig, i)->Id ), i+1 );

    // create random info for the remaining timeframes
    for ( f = 1; f < p->nFrames; f++ )
        Saig_ManForEachPi( p->pAig, pObj, i )
            Ssw_SmlAssignRandomFrame( p, pObj, f );
}